

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_ParseInt64::test_method(test_ParseInt64 *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  check_type cVar4;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined1 *local_88;
  char **local_80;
  assertion_result local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  int64_t n;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x351;
  file.m_begin = (iterator)&local_50;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  str._M_str = "1234";
  str._M_len = 4;
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseInt64(str,(int64_t *)0x0);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"1234\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_b8,0x351);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x352;
  file_00.m_begin = (iterator)&local_c8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d8,msg_00
            );
  str_00._M_str = "0";
  str_00._M_len = 1;
  bVar1 = ParseInt64(str_00,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == 0 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"0\", &n) && n == 0LL";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_e8,0x352);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x353;
  file_01.m_begin = (iterator)&local_f8;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_108,
             msg_01);
  str_01._M_str = "1234";
  str_01._M_len = 4;
  bVar1 = ParseInt64(str_01,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == 0x4d2 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"1234\", &n) && n == 1234LL";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_110 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_118,0x353);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x354;
  file_02.m_begin = (iterator)&local_128;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_138,
             msg_02);
  str_02._M_str = "01234";
  str_02._M_len = 5;
  bVar1 = ParseInt64(str_02,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == 0x4d2 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"01234\", &n) && n == 1234LL";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_148,0x354);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x355;
  file_03.m_begin = (iterator)&local_158;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_168,
             msg_03);
  str_03._M_str = "2147483647";
  str_03._M_len = 10;
  bVar1 = ParseInt64(str_03,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == 0x7fffffff && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"2147483647\", &n) && n == 2147483647LL";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_170 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_178,0x355);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x356;
  file_04.m_begin = (iterator)&local_188;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_198,
             msg_04);
  str_04._M_str = "-2147483648";
  str_04._M_len = 0xb;
  bVar1 = ParseInt64(str_04,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == -0x80000000 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"-2147483648\", &n) && n == -2147483648LL";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_1a8,0x356);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x357;
  file_05.m_begin = (iterator)&local_1b8;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c8,
             msg_05);
  str_05._M_str = "9223372036854775807";
  str_05._M_len = 0x13;
  bVar1 = ParseInt64(str_05,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == 0x7fffffffffffffff && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"9223372036854775807\", &n) && n == int64_t{9223372036854775807}";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a8;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_1d8,0x357);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x358;
  file_06.m_begin = (iterator)&local_1e8;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f8,
             msg_06);
  str_06._M_str = "-9223372036854775808";
  str_06._M_len = 0x14;
  bVar1 = ParseInt64(str_06,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == -0x8000000000000000 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"-9223372036854775808\", &n) && n == int64_t{-9223372036854775807-1}";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_200 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_208,0x358);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x359;
  file_07.m_begin = (iterator)&local_218;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_228,
             msg_07);
  str_07._M_str = "-1234";
  str_07._M_len = 5;
  bVar1 = ParseInt64(str_07,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(n == -0x4d2 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseInt64(\"-1234\", &n) && n == -1234LL";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_230 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_238,0x359);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x35b;
  file_08.m_begin = (iterator)&local_248;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_258,
             msg_08);
  bVar1 = ParseInt64((string_view)(ZEXT816(0xc7f1cc) << 0x40),&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_260 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_268,0x35b);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x35c;
  file_09.m_begin = (iterator)&local_278;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_288,
             msg_09);
  str_08._M_str = " 1";
  str_08._M_len = 2;
  bVar1 = ParseInt64(str_08,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\" 1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_290 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_298,0x35c);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x35d;
  file_10.m_begin = (iterator)&local_2a8;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2b8,
             msg_10);
  str_09._M_str = "1 ";
  str_09._M_len = 2;
  bVar1 = ParseInt64(str_09,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"1 \", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2c0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_2c8,0x35d);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x35e;
  file_11.m_begin = (iterator)&local_2d8;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2e8,
             msg_11);
  str_10._M_str = "1a";
  str_10._M_len = 2;
  bVar1 = ParseInt64(str_10,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"1a\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_2f8,0x35e);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x35f;
  file_12.m_begin = (iterator)&local_308;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_318,
             msg_12);
  str_11._M_str = "aap";
  str_11._M_len = 3;
  bVar1 = ParseInt64(str_11,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"aap\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_320 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_328,0x35f);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x360;
  file_13.m_begin = (iterator)&local_338;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_348,
             msg_13);
  str_12._M_str = "0x1";
  str_12._M_len = 3;
  bVar1 = ParseInt64(str_12,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"0x1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_350 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_358,0x360);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x361;
  file_14.m_begin = (iterator)&local_368;
  msg_14.m_end = pvVar3;
  msg_14.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_378,
             msg_14);
  str_13._M_str = STRING_WITH_EMBEDDED_NULL_CHAR_abi_cxx11_._M_dataplus._M_p;
  str_13._M_len = STRING_WITH_EMBEDDED_NULL_CHAR_abi_cxx11_._M_string_length;
  bVar1 = ParseInt64(str_13,&n);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(STRING_WITH_EMBEDDED_NULL_CHAR, &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_380 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_388,0x361);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x363;
  file_15.m_begin = (iterator)&local_398;
  msg_15.m_end = pvVar3;
  msg_15.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3a8,
             msg_15);
  str_14._M_str = "-9223372036854775809";
  str_14._M_len = 0x14;
  bVar1 = ParseInt64(str_14,(int64_t *)0x0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"-9223372036854775809\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_3b8,0x363);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x364;
  file_16.m_begin = (iterator)&local_3c8;
  msg_16.m_end = pvVar3;
  msg_16.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3d8,
             msg_16);
  str_15._M_str = "9223372036854775808";
  str_15._M_len = 0x13;
  bVar1 = ParseInt64(str_15,(int64_t *)0x0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"9223372036854775808\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3e0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_3e8,0x364);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x365;
  file_17.m_begin = (iterator)&local_3f8;
  msg_17.m_end = pvVar3;
  msg_17.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_408,
             msg_17);
  str_16._M_str = "-32482348723847471234";
  str_16._M_len = 0x15;
  bVar1 = ParseInt64(str_16,(int64_t *)0x0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"-32482348723847471234\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_410 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_418,0x365);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x366;
  file_18.m_begin = (iterator)&local_428;
  msg_18.m_end = pvVar3;
  msg_18.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_438,
             msg_18);
  str_17._M_str = "32482348723847471234";
  str_17._M_len = 0x14;
  bVar1 = ParseInt64(str_17,(int64_t *)0x0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseInt64(\"32482348723847471234\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_440 = "";
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_448,0x366);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ParseInt64)
{
    int64_t n;
    // Valid values
    BOOST_CHECK(ParseInt64("1234", nullptr));
    BOOST_CHECK(ParseInt64("0", &n) && n == 0LL);
    BOOST_CHECK(ParseInt64("1234", &n) && n == 1234LL);
    BOOST_CHECK(ParseInt64("01234", &n) && n == 1234LL); // no octal
    BOOST_CHECK(ParseInt64("2147483647", &n) && n == 2147483647LL);
    BOOST_CHECK(ParseInt64("-2147483648", &n) && n == -2147483648LL);
    BOOST_CHECK(ParseInt64("9223372036854775807", &n) && n == int64_t{9223372036854775807});
    BOOST_CHECK(ParseInt64("-9223372036854775808", &n) && n == int64_t{-9223372036854775807-1});
    BOOST_CHECK(ParseInt64("-1234", &n) && n == -1234LL);
    // Invalid values
    BOOST_CHECK(!ParseInt64("", &n));
    BOOST_CHECK(!ParseInt64(" 1", &n)); // no padding inside
    BOOST_CHECK(!ParseInt64("1 ", &n));
    BOOST_CHECK(!ParseInt64("1a", &n));
    BOOST_CHECK(!ParseInt64("aap", &n));
    BOOST_CHECK(!ParseInt64("0x1", &n)); // no hex
    BOOST_CHECK(!ParseInt64(STRING_WITH_EMBEDDED_NULL_CHAR, &n));
    // Overflow and underflow
    BOOST_CHECK(!ParseInt64("-9223372036854775809", nullptr));
    BOOST_CHECK(!ParseInt64("9223372036854775808", nullptr));
    BOOST_CHECK(!ParseInt64("-32482348723847471234", nullptr));
    BOOST_CHECK(!ParseInt64("32482348723847471234", nullptr));
}